

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidpathLenConstraintTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section6InvalidpathLenConstraintTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  undefined1 local_d8 [8];
  PkitsTestInfo info;
  char *crls [4];
  char *certs [5];
  Section6InvalidpathLenConstraintTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  crls[3] = "TrustAnchorRootCertificate";
  crls[1] = "pathLenConstraint6subCA0CRL";
  crls[2] = "pathLenConstraint6subsubCA00CRL";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  crls[0] = "pathLenConstraint6CACRL";
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_d8);
  local_d8 = (undefined1  [8])0x6f49be;
  info.time.year._0_1_ = 0;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<5ul,4ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)this,
             (char *(*) [5])(crls + 3),
             (char *(*) [4])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_d8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_d8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidpathLenConstraintTest9) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "pathLenConstraint6CACert",
      "pathLenConstraint6subCA0Cert", "pathLenConstraint6subsubCA00Cert",
      "InvalidpathLenConstraintTest9EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint6CACRL",
                              "pathLenConstraint6subCA0CRL",
                              "pathLenConstraint6subsubCA00CRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.9";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}